

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_io_stream * jx9VmGetStreamDevice(jx9_vm *pVm,char **pzDevice,int nByte)

{
  uint uVar1;
  void *pvVar2;
  jx9_io_stream *pjVar3;
  sxu32 SLen;
  char *pcVar4;
  ushort **ppuVar5;
  bool bVar6;
  int local_8c;
  int rc;
  sxu32 nEntry;
  sxu32 n;
  SyString sCur;
  SyString sDev;
  jx9_io_stream *pStream;
  jx9_io_stream **apStream;
  char *zNext;
  char *zCur;
  char *zEnd;
  char *zIn;
  int nByte_local;
  char **pzDevice_local;
  jx9_vm *pVm_local;
  
  sCur._8_8_ = *pzDevice;
  pcVar4 = (char *)(sCur._8_8_ + (long)nByte);
  zEnd = (char *)sCur._8_8_;
  do {
    apStream = (jx9_io_stream **)sCur._8_8_;
    if (pcVar4 <= zEnd) {
LAB_001446e5:
      if (zEnd < pcVar4) {
        sDev.zString._0_4_ = (int)zEnd - (int)sCur._8_8_;
        while( true ) {
          bVar6 = false;
          if (((sxu32)sDev.zString != 0) && (bVar6 = false, *(byte *)sCur._8_8_ < 0xc0)) {
            ppuVar5 = __ctype_b_loc();
            bVar6 = ((*ppuVar5)[(int)*(char *)sCur._8_8_] & 0x2000) != 0;
          }
          if (!bVar6) break;
          sDev.zString._0_4_ = (sxu32)sDev.zString - 1;
          sCur._8_8_ = sCur._8_8_ + 1;
        }
        while( true ) {
          bVar6 = false;
          if (((sxu32)sDev.zString != 0) &&
             (bVar6 = false, *(byte *)(sCur._8_8_ + (ulong)((sxu32)sDev.zString - 1)) < 0xc0)) {
            ppuVar5 = __ctype_b_loc();
            bVar6 = ((*ppuVar5)[(int)*(char *)(sCur._8_8_ + (ulong)((sxu32)sDev.zString - 1))] &
                    0x2000) != 0;
          }
          if (!bVar6) break;
          sDev.zString._0_4_ = (sxu32)sDev.zString - 1;
        }
        pvVar2 = (pVm->aIOstream).pBase;
        uVar1 = (pVm->aIOstream).nUsed;
        for (rc = 0; (uint)rc < uVar1; rc = rc + 1) {
          pjVar3 = *(jx9_io_stream **)((long)pvVar2 + (ulong)(uint)rc * 8);
          pcVar4 = pjVar3->zName;
          SLen = SyStrlen(pjVar3->zName);
          if ((sxu32)sDev.zString == SLen) {
            local_8c = SyStrnicmp((char *)sCur._8_8_,pcVar4,SLen);
          }
          else {
            local_8c = (sxu32)sDev.zString - SLen;
          }
          if (local_8c == 0) {
            *pzDevice = (char *)apStream;
            return pjVar3;
          }
        }
        pVm_local = (jx9_vm *)0x0;
      }
      else {
        pVm_local = (jx9_vm *)pVm->pDefStream;
      }
      return (jx9_io_stream *)pVm_local;
    }
    if ((((zEnd < pcVar4 + -3) && (*zEnd == ':')) && (zEnd[1] == '/')) && (zEnd[2] == '/')) {
      apStream = (jx9_io_stream **)(zEnd + 3);
      goto LAB_001446e5;
    }
    zEnd = zEnd + 1;
  } while( true );
}

Assistant:

JX9_PRIVATE const jx9_io_stream * jx9VmGetStreamDevice(
	jx9_vm *pVm,           /* Target VM */
	const char **pzDevice, /* Full path, URI, ... */
	int nByte              /* *pzDevice length*/
	)
{
	const char *zIn, *zEnd, *zCur, *zNext;
	jx9_io_stream **apStream, *pStream;
	SyString sDev, sCur;
	sxu32 n, nEntry;
	int rc;
	/* Check if a scheme [i.e: file://, http://, zip://...] is available */
	zNext = zCur = zIn = *pzDevice;
	zEnd = &zIn[nByte];
	while( zIn < zEnd ){
		if( zIn < &zEnd[-3]/*://*/ && zIn[0] == ':' && zIn[1] == '/' && zIn[2] == '/' ){
			/* Got one */
			zNext = &zIn[sizeof("://")-1];
			break;
		}
		/* Advance the cursor */
		zIn++;
	}
	if( zIn >= zEnd ){
		/* No such scheme, return the default stream */
		return pVm->pDefStream;
	}
	SyStringInitFromBuf(&sDev, zCur, zIn-zCur);
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sDev);
	/* Perform a linear lookup on the installed stream devices */
	apStream = (jx9_io_stream **)SySetBasePtr(&pVm->aIOstream);
	nEntry = SySetUsed(&pVm->aIOstream);
	for( n = 0 ; n < nEntry ; n++ ){
		pStream = apStream[n];
		SyStringInitFromBuf(&sCur, pStream->zName, SyStrlen(pStream->zName));
		/* Perfrom a case-insensitive comparison */
		rc = SyStringCmp(&sDev, &sCur, SyStrnicmp);
		if( rc == 0 ){
			/* Stream device found */
			*pzDevice = zNext;
			return pStream;
		}
	}
	/* No such stream, return NULL */
	return 0;
}